

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O3

void CodegenC::codegen(Program *program,char *source_path,TailCallData *tail_call_data)

{
  Type *pTVar1;
  _Base_ptr p_Var2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long *plVar6;
  char *pcVar7;
  _Base_ptr p_Var8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long *plVar11;
  char **ppcVar12;
  char (**ppacVar13) [6];
  _Base_ptr p_Var14;
  Function *pFVar15;
  string command;
  Printer status_printer;
  string c_path;
  IndentPrinter printer;
  size_t arguments;
  size_t index;
  Variable result;
  Type result_type;
  IndentPrinter type_declaration_printer;
  IndentPrinter function_declaration_printer;
  string executable_path;
  IndentPrinter type_function_printer;
  FunctionTable function_table;
  ostringstream functions;
  ostringstream type_functions;
  ostringstream function_declarations;
  ostringstream type_declarations;
  undefined1 local_a00 [16];
  char *local_9f0;
  long lStack_9e8;
  allocator<char> local_9d9;
  Printer local_9d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c0;
  IndentPrinter local_9b0;
  TailCallData *local_9a0;
  char **local_998;
  char *local_990;
  char *local_988;
  long lStack_980;
  char *local_978 [2];
  char (*local_968) [6];
  long lStack_960;
  char *local_958;
  Function *local_950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_938;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_928;
  long local_918;
  long lStack_910;
  _Base_ptr local_908;
  long *local_900;
  long local_8f8;
  long local_8f0;
  long lStack_8e8;
  long *local_8e0 [2];
  long local_8d0 [2];
  IndentPrinter local_8c0;
  IndentPrinter local_8b0;
  undefined1 local_8a0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_898;
  char *local_890 [2];
  FunctionTable *local_880;
  ios_base local_7a8 [264];
  IndentPrinter local_6a0;
  FunctionTable local_690;
  ostringstream local_610 [112];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_9a0 = tail_call_data;
  local_958 = source_path;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream(local_610);
  local_690.type_declaration_printer = &local_8c0;
  local_8c0.indentation = 0;
  local_690.function_declaration_printer = &local_8b0;
  local_8b0.indentation = 0;
  local_690.type_function_printer = &local_6a0;
  local_6a0.indentation = 0;
  local_9b0.indentation = 0;
  local_690.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_690.functions._M_t._M_impl.super__Rb_tree_header._M_header;
  local_690.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_690.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_690.functions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_690.types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_690.types._M_t._M_impl.super__Rb_tree_header._M_header;
  local_690.types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_690.types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_690.types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_690.next_type_index = 0;
  local_9b0.printer.ostream = (ostream *)local_610;
  local_8c0.printer.ostream = (ostream *)local_1a8;
  local_8b0.printer.ostream = (ostream *)local_320;
  local_6a0.printer.ostream = (ostream *)local_498;
  local_690.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_690.functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_690.types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_690.types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  IndentPrinter::println<char[20]>
            (local_690.type_declaration_printer,(char (*) [20])"#include <stdlib.h>");
  IndentPrinter::println<char[20]>(&local_8c0,(char (*) [20])"#include <stdint.h>");
  IndentPrinter::println<char[19]>(&local_8c0,(char (*) [19])"#include <stdio.h>");
  IndentPrinter::println<char[34]>(&local_9b0,(char (*) [34])"int main(int argc, char **argv) {");
  local_9b0.indentation = local_9b0.indentation + 1;
  sVar4 = FunctionTable::look_up(&local_690,program->first);
  local_8a0 = (undefined1  [8])&local_9d0;
  local_9d0._M_allocated_capacity._0_4_ = (int)sVar4;
  local_890[0] = "f%();";
  IndentPrinter::println<Format<PrintNumber>>(&local_9b0,(Format<PrintNumber> *)local_8a0);
  IndentPrinter::println<char[10]>(&local_9b0,(char (*) [10])"return 0;");
  local_9b0.indentation = local_9b0.indentation - 1;
  IndentPrinter::println<char[2]>(&local_9b0,(char (*) [2])0x13a897);
  pFVar15 = program->first;
  if (pFVar15 != (Function *)0x0) {
    local_908 = &(local_9a0->tail_call_functions)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pTVar1 = pFVar15->return_type;
      local_9d0._M_allocated_capacity = (size_type)pFVar15;
      local_950 = pFVar15;
      pcVar5 = (char *)FunctionTable::define_type(&local_690,pTVar1);
      FunctionTable::generate_functions(&local_690,pTVar1);
      local_a00._0_8_ = pcVar5;
      local_978[0] = (char *)FunctionTable::look_up
                                       (&local_690,(Function *)local_9d0._M_allocated_capacity);
      local_998 = (char **)((long)*(pointer *)(local_9d0._M_allocated_capacity + 0x40) -
                            (long)(((vector<const_Type_*,_std::allocator<const_Type_*>_> *)
                                   (local_9d0._M_allocated_capacity + 0x38))->
                                  super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 3);
      local_8a0 = (undefined1  [8])local_a00;
      local_898 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_978;
      local_890[0] = (char *)&local_998;
      local_890[1] = (char *)&local_9d0;
      local_880 = &local_690;
      IndentPrinter::
      println<PrintFunctor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_1_>>
                (&local_8b0,
                 (PrintFunctor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]moebius_codegen_c_hpp:992:55)>
                  *)local_8a0);
      local_8a0 = (undefined1  [8])local_a00;
      local_898 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_978;
      local_890[0] = (char *)&local_998;
      local_890[1] = (char *)&local_9d0;
      local_880 = &local_690;
      IndentPrinter::
      println<PrintFunctor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_2_>>
                (&local_9b0,
                 (PrintFunctor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]moebius_codegen_c_hpp:1005:45)>
                  *)local_8a0);
      p_Var2 = local_908;
      pFVar15 = local_950;
      local_9b0.indentation = local_9b0.indentation + 1;
      p_Var8 = (local_9a0->tail_call_functions)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var14 = local_908;
      if (p_Var8 != (_Base_ptr)0x0) {
        do {
          if (*(Function **)(p_Var8 + 1) >= local_9d0._M_allocated_capacity) {
            p_Var14 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(Function **)(p_Var8 + 1) < local_9d0._M_allocated_capacity];
        } while (p_Var8 != (_Base_ptr)0x0);
        if ((p_Var14 != local_908) &&
           (*(Function **)(p_Var14 + 1) <= local_9d0._M_allocated_capacity)) {
          IndentPrinter::println<char[12]>(&local_9b0,(char (*) [12])"while (1) {");
          local_9b0.indentation = local_9b0.indentation + 1;
        }
      }
      local_948._M_allocated_capacity = (size_type)local_998;
      iVar3 = (*(*(Type **)(local_9d0._M_allocated_capacity + 0x50))->_vptr_Type[2])();
      if (iVar3 != 9) {
        pTVar1 = *(Type **)(local_9d0._M_allocated_capacity + 0x50);
        sVar4 = FunctionTable::define_type(&local_690,pTVar1);
        FunctionTable::generate_functions(&local_690,pTVar1);
        local_8a0 = (undefined1  [8])&local_928;
        local_898 = &local_948;
        local_890[1] = (char *)((long)"% % = % % %;" + 8);
        local_928._M_allocated_capacity = sVar4;
        IndentPrinter::println<Format<CodegenC::Type,Variable>>
                  (&local_9b0,(Format<CodegenC::Type,_Variable> *)local_8a0);
        pFVar15 = local_950;
      }
      evaluate(&local_690,&local_9b0,(long)local_998 + 1,(Variable)local_948._M_allocated_capacity,
               local_9a0,(Block *)(local_9d0._M_allocated_capacity + 0x20));
      iVar3 = (*(*(Type **)(local_9d0._M_allocated_capacity + 0x50))->_vptr_Type[2])();
      if (iVar3 == 9) {
        IndentPrinter::println<char[8]>(&local_9b0,(char (*) [8])"return;");
      }
      else {
        local_8a0 = (undefined1  [8])&local_948;
        local_890[0] = "return %;";
        IndentPrinter::println<Format<Variable>>(&local_9b0,(Format<Variable> *)local_8a0);
      }
      p_Var8 = (local_9a0->tail_call_functions)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var14 = p_Var2;
      if (p_Var8 != (_Base_ptr)0x0) {
        do {
          if (*(Function **)(p_Var8 + 1) >= local_9d0._M_allocated_capacity) {
            p_Var14 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(Function **)(p_Var8 + 1) < local_9d0._M_allocated_capacity];
        } while (p_Var8 != (_Base_ptr)0x0);
        if ((p_Var14 != p_Var2) && (*(Function **)(p_Var14 + 1) <= local_9d0._M_allocated_capacity))
        {
          local_9b0.indentation = local_9b0.indentation - 1;
          IndentPrinter::println<char[2]>(&local_9b0,(char (*) [2])0x13a897);
        }
      }
      local_9b0.indentation = local_9b0.indentation - 1;
      IndentPrinter::println<char[2]>(&local_9b0,(char (*) [2])0x13a897);
      pFVar15 = pFVar15->next_function;
    } while (pFVar15 != (Function *)0x0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_8a0,local_958,(allocator<char> *)local_a00);
  plVar6 = (long *)std::__cxx11::string::append(local_8a0);
  local_9d0._M_allocated_capacity = (size_type)&local_9c0;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_9c0._M_allocated_capacity = *psVar9;
    local_9c0._8_8_ = plVar6[3];
  }
  else {
    local_9c0._M_allocated_capacity = *psVar9;
    local_9d0._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_9d0._8_8_ = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_8a0 != (undefined1  [8])local_890) {
    operator_delete((void *)local_8a0,(long)local_890[0] + 1);
  }
  std::ofstream::ofstream(local_8a0,(string *)local_9d0._M_local_buf,_S_out);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_8a0,(char *)local_a00._0_8_,local_a00._8_8_);
  pcVar5 = local_a00 + 0x10;
  if ((char *)local_a00._0_8_ != pcVar5) {
    operator_delete((void *)local_a00._0_8_,(long)local_9f0 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_8a0,(char *)local_a00._0_8_,local_a00._8_8_);
  if ((char *)local_a00._0_8_ != pcVar5) {
    operator_delete((void *)local_a00._0_8_,(long)local_9f0 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_8a0,(char *)local_a00._0_8_,local_a00._8_8_);
  if ((char *)local_a00._0_8_ != pcVar5) {
    operator_delete((void *)local_a00._0_8_,(long)local_9f0 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_8a0,(char *)local_a00._0_8_,local_a00._8_8_);
  if ((char *)local_a00._0_8_ != pcVar5) {
    operator_delete((void *)local_a00._0_8_,(long)local_9f0 + 1);
  }
  local_8a0 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_8a0 + _VTT[-3].index) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&local_898);
  std::ios_base::~ios_base(local_7a8);
  local_9d8.ostream = (ostream *)&std::cerr;
  local_8a0 = (undefined1  [8])0x13a642;
  local_890[0] = "\x1b[22m";
  local_898 = &local_9d0;
  PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
  ::print((PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
           *)local_8a0,&local_9d8);
  local_a00._0_8_ = "\x1b[32m";
  local_a00._8_8_ = " successfully generated";
  local_9f0 = "\x1b[39m";
  local_8a0 = (undefined1  [8])0x13a642;
  local_890[0] = "\x1b[22m";
  local_898 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a00;
  PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]>::print
            ((PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]> *)local_8a0,
             &local_9d8);
  std::ostream::put((char)local_9d8.ostream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a00,local_958,(allocator<char> *)local_978);
  plVar6 = (long *)std::__cxx11::string::append(local_a00);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar10) {
    local_890[0] = (char *)paVar10->_M_allocated_capacity;
    local_890[1] = (char *)plVar6[3];
    local_8a0 = (undefined1  [8])local_890;
  }
  else {
    local_890[0] = (char *)paVar10->_M_allocated_capacity;
    local_8a0 = (undefined1  [8])*plVar6;
  }
  local_898 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar6[1];
  *plVar6 = (long)paVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((char *)local_a00._0_8_ != pcVar5) {
    operator_delete((void *)local_a00._0_8_,(ulong)(local_9f0 + 1));
  }
  pcVar7 = getenv("CC");
  pcVar5 = "cc";
  if (pcVar7 != (char *)0x0) {
    pcVar5 = pcVar7;
  }
  getenv("CFLAGS");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_8e0,pcVar5,&local_9d9);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_8e0);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_8f0 = *plVar11;
    lStack_8e8 = plVar6[3];
    local_900 = &local_8f0;
  }
  else {
    local_8f0 = *plVar11;
    local_900 = (long *)*plVar6;
  }
  local_8f8 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_900);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_918 = *plVar11;
    lStack_910 = plVar6[3];
    local_928._M_allocated_capacity = (size_type)&local_918;
  }
  else {
    local_918 = *plVar11;
    local_928._M_allocated_capacity = (size_type)(long *)*plVar6;
  }
  local_928._8_8_ = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_928._M_local_buf);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_938._M_allocated_capacity = *psVar9;
    local_938._8_8_ = plVar6[3];
    local_948._M_allocated_capacity = (size_type)&local_938;
  }
  else {
    local_938._M_allocated_capacity = *psVar9;
    local_948._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_948._8_8_ = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_948._M_local_buf,(ulong)local_8a0);
  ppcVar12 = (char **)(plVar6 + 2);
  if ((char **)*plVar6 == ppcVar12) {
    local_988 = *ppcVar12;
    lStack_980 = plVar6[3];
    local_998 = &local_988;
  }
  else {
    local_988 = *ppcVar12;
    local_998 = (char **)*plVar6;
  }
  local_990 = (char *)plVar6[1];
  *plVar6 = (long)ppcVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_998);
  ppacVar13 = (char (**) [6])(plVar6 + 2);
  if ((char (**) [6])*plVar6 == ppacVar13) {
    local_968 = *ppacVar13;
    lStack_960 = plVar6[3];
    local_978[0] = (char *)&local_968;
  }
  else {
    local_968 = *ppacVar13;
    local_978[0] = (char *)*plVar6;
  }
  local_978[1] = (char *)plVar6[1];
  *plVar6 = (long)ppacVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_978,local_9d0._M_allocated_capacity);
  local_a00._0_8_ = local_a00 + 0x10;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_9f0 = (char *)*plVar11;
    lStack_9e8 = plVar6[3];
  }
  else {
    local_9f0 = (char *)*plVar11;
    local_a00._0_8_ = (long *)*plVar6;
  }
  local_a00._8_8_ = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((char (**) [6])local_978[0] != &local_968) {
    operator_delete(local_978[0],(ulong)(*local_968 + 1));
  }
  if (local_998 != &local_988) {
    operator_delete(local_998,(ulong)(local_988 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_allocated_capacity != &local_938) {
    operator_delete((void *)local_948._M_allocated_capacity,local_938._M_allocated_capacity + 1);
  }
  if ((long *)local_928._M_allocated_capacity != &local_918) {
    operator_delete((void *)local_928._M_allocated_capacity,local_918 + 1);
  }
  if (local_900 != &local_8f0) {
    operator_delete(local_900,local_8f0 + 1);
  }
  if (local_8e0[0] != local_8d0) {
    operator_delete(local_8e0[0],local_8d0[0] + 1);
  }
  iVar3 = system((char *)local_a00._0_8_);
  if (iVar3 == 0) {
    local_978[0] = "\x1b[1m";
    local_978[1] = local_8a0;
    local_968 = (char (*) [6])0x13a647;
    PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
    ::print((PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
             *)local_978,&local_9d8);
    local_998 = (char **)0x13a64d;
    local_990 = " successfully generated";
    local_988 = "\x1b[39m";
    local_978[0] = "\x1b[1m";
    local_968 = (char (*) [6])0x13a647;
    local_978[1] = (char *)&local_998;
    PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]>::print
              ((PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]> *)local_978,
               &local_9d8);
    std::ostream::put((char)local_9d8.ostream);
  }
  if ((undefined1 *)local_a00._0_8_ != local_a00 + 0x10) {
    operator_delete((void *)local_a00._0_8_,(long)local_9f0 + 1);
  }
  if (local_8a0 != (undefined1  [8])local_890) {
    operator_delete((void *)local_8a0,(ulong)((long)local_890[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_allocated_capacity != &local_9c0) {
    operator_delete((void *)local_9d0._M_allocated_capacity,local_9c0._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<const_Type_*,_std::pair<const_Type_*const,_CodegenC::TypeTableEntry>,_std::_Select1st<std::pair<const_Type_*const,_CodegenC::TypeTableEntry>_>,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_CodegenC::TypeTableEntry>_>_>
  ::~_Rb_tree(&local_690.types._M_t);
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Function_*const,_unsigned_long>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<const_Function_*,_std::pair<const_Function_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Function_*const,_unsigned_long>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
               *)&local_690);
  std::__cxx11::ostringstream::~ostringstream(local_610);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

static void codegen(const Program& program, const char* source_path, const TailCallData& tail_call_data) {
		std::ostringstream type_declarations;
		std::ostringstream function_declarations;
		std::ostringstream type_functions;
		std::ostringstream functions;
		IndentPrinter type_declaration_printer(type_declarations);
		IndentPrinter function_declaration_printer(function_declarations);
		IndentPrinter type_function_printer(type_functions);
		IndentPrinter printer(functions);
		FunctionTable function_table(type_declaration_printer, function_declaration_printer, type_function_printer);
		type_declaration_printer.println("#include <stdlib.h>");
		type_declaration_printer.println("#include <stdint.h>");
		type_declaration_printer.println("#include <stdio.h>");
		{
			printer.println_increasing("int main(int argc, char **argv) {");
			const std::size_t index = function_table.look_up(program.get_main_function());
			printer.println(format("f%();", print_number(index)));
			printer.println("return 0;");
			printer.println_decreasing("}");
		}
		for (const Function* function: program) {
			const Type return_type = function_table.get_type(function->get_return_type());
			const std::size_t index = function_table.look_up(function);
			const std::size_t arguments = function->get_argument_types().size();
			function_declaration_printer.println(print_functor([&](auto& printer) {
				printer.print(format("static % f%(", return_type, print_number(index)));
				bool is_first_argument = true;
				for (std::size_t i = 0; i < arguments; ++i) {
					if (function->get_argument_types()[i] != TypeInterner::get_void_type()) {
						if (is_first_argument) is_first_argument = false;
						else printer.print(", ");
						const Type argument_type = function_table.get_type(function->get_argument_types()[i]);
						printer.print(format("% %", argument_type, Variable(i)));
					}
				}
				printer.print(");");
			}));
			printer.println_increasing(print_functor([&](auto& printer) {
				printer.print(format("static % f%(", return_type, print_number(index)));
				bool is_first_argument = true;
				for (std::size_t i = 0; i < arguments; ++i) {
					if (function->get_argument_types()[i] != TypeInterner::get_void_type()) {
						if (is_first_argument) is_first_argument = false;
						else printer.print(", ");
						const Type argument_type = function_table.get_type(function->get_argument_types()[i]);
						printer.print(format("% %", argument_type, Variable(i)));
					}
				}
				printer.print(") {");
			}));
			if (tail_call_data.has_tail_call(function)) {
				printer.println_increasing("while (1) {");
			}
			const Variable result = Variable(arguments);
			if (function->get_return_type()->get_id() != TypeId::VOID) {
				const Type result_type = function_table.get_type(function->get_return_type());
				printer.println(format("% %;", result_type, result));
			}
			CodegenC::evaluate(function_table, printer, arguments + 1, result, tail_call_data, function->get_block());
			if (function->get_return_type()->get_id() != TypeId::VOID) {
				printer.println(format("return %;", result));
			}
			else {
				printer.println("return;");
			}
			if (tail_call_data.has_tail_call(function)) {
				printer.println_decreasing("}");
			}
			printer.println_decreasing("}");
		}
		std::string c_path = std::string(source_path) + ".c";
		{
			std::ofstream file(c_path);
			file << type_declarations.str();
			file << function_declarations.str();
			file << type_functions.str();
			file << functions.str();
		}
		Printer status_printer(std::cerr);
		status_printer.print(bold(c_path));
		status_printer.print(bold(green(" successfully generated")));
		status_printer.print('\n');
		std::string executable_path = std::string(source_path) + ".exe";
		const char* c_compiler = getenv("CC", "cc");
		const char* compiler_arguments = getenv("CFLAGS", "");
		std::string command = std::string(c_compiler) + " " + compiler_arguments + " -o " + executable_path + " " + c_path;
		if (std::system(command.c_str()) == 0) {
			status_printer.print(bold(executable_path));
			status_printer.print(bold(green(" successfully generated")));
			status_printer.print('\n');
		}
	}